

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAddqAn<(moira::Instr)121,(moira::Mode)1,(moira::Size)4>(Moira *this,u16 opcode)

{
  Moira *in_RDI;
  u32 result;
  int dst;
  i8 src;
  u32 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  readA<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffdc);
  prefetch<4ul>(in_RDI);
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,4);
  writeA<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void
Moira::execAddqAn(u16 opcode)
{
    i8  src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    if (src == 0) src = 8;
    u32 result = (I == ADDQ) ? readA(dst) + src : readA(dst) - src;
    prefetch<POLLIPL>();

    sync(4);
    writeA(dst, result);
}